

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

StringEnumeration *
icu_63::TimeZoneNamesImpl::_getAvailableMetaZoneIDs(UnicodeString *tzID,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode UVar2;
  UVector *this;
  UVector *this_00;
  undefined8 *puVar3;
  MetaZoneIDsEnumeration *pMVar4;
  UErrorCode *size;
  void *size_00;
  void *obj;
  int32_t i;
  int index;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    size = status;
    this = ZoneMeta::getMetazoneMappings(tzID);
    if (this == (UVector *)0x0) {
      pMVar4 = (MetaZoneIDsEnumeration *)UMemory::operator_new((UMemory *)0x90,(size_t)size);
      if (pMVar4 != (MetaZoneIDsEnumeration *)0x0) {
        MetaZoneIDsEnumeration::MetaZoneIDsEnumeration(pMVar4);
        return &pMVar4->super_StringEnumeration;
      }
    }
    else {
      this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
      if (this_00 == (UVector *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        size_00 = (void *)0x0;
        UVector::UVector(this_00,(UObjectDeleter *)0x0,uhash_compareUChars_63,status);
        UVar2 = *status;
        index = 0;
        if (U_ZERO_ERROR < UVar2) {
          return (StringEnumeration *)0x0;
        }
        while (UVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
          if (this->count <= index) {
            pMVar4 = (MetaZoneIDsEnumeration *)
                     UMemory::operator_new((UMemory *)0x90,(size_t)size_00);
            if (pMVar4 == (MetaZoneIDsEnumeration *)0x0) {
              return (StringEnumeration *)0x0;
            }
            MetaZoneIDsEnumeration::MetaZoneIDsEnumeration(pMVar4,this_00);
            return &pMVar4->super_StringEnumeration;
          }
          puVar3 = (undefined8 *)UVector::elementAt(this,index);
          obj = (void *)*puVar3;
          size_00 = obj;
          UVar1 = UVector::contains(this_00,obj);
          if (UVar1 == '\0') {
            UVector::addElement(this_00,obj,status);
            size_00 = obj;
          }
          index = index + 1;
          UVar2 = *status;
        }
        if (this_00 != (UVector *)0x0) {
          (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
        }
      }
    }
  }
  return (StringEnumeration *)0x0;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }